

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_first_back_by_c_str_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_first_back_by_c_str_Test<char16_t> *this)

{
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionResult iutest_ar;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  allocator<char> local_209;
  AssertionResult local_208;
  AssertionHelper local_1e0;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_1b0;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_1a0;
  undefined1 local_190 [392];
  
  local_1a0._M_len = 0x13;
  local_1a0._M_str = L"arikitari na_world!";
  local_190._0_8_ = L"_ ";
  local_1b0 = ::detail::
              operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_const_char16_t_*,_char16_t,_nullptr>
                        (&local_1a0,
                         (split_helper_subroutine<detail::split_at_first_back,_const_char16_t_*,_char16_t>
                          *)local_190);
  local_190._0_8_ = L"na_world!";
  iutest::internal::
  CmpHelperEQ<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (&local_208,(internal *)"constant::na_world<char_type>()","re",local_190,
             (char16_t **)&local_1b0,in_R9);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
    local_1e0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x5c;
    local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_first_back_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_first().back();
	IUTEST_ASSERT_EQ(constant::na_world<char_type>(), re);
}